

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

void __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>
::
AddUniqueElement<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>
           *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *a,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *v)

{
  bool bVar1;
  GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this_00;
  GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *pGVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> c;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_30;
  
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)
            GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Begin(a);
  do {
    pGVar2 = (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)
             GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::End(a);
    if (this_00 == pGVar2) {
      GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
      GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)&local_30,v,
                 *(CrtAllocator **)this,false);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack
                (a,&local_30,*(CrtAllocator **)this);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_30);
      return;
    }
    bVar1 = GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::operator==(this_00,v);
    this_00 = this_00 + 0x10;
  } while (!bVar1);
  return;
}

Assistant:

void AddUniqueElement(V1& a, const V2& v) {
        for (typename V1::ConstValueIterator itr = a.Begin(); itr != a.End(); ++itr)
            if (*itr == v)
                return;
        V1 c(v, *allocator_);
        a.PushBack(c, *allocator_);
    }